

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template-parser.c
# Opt level: O1

void blogc_template_free_ast(bc_slist_t *ast)

{
  void *__ptr;
  _bc_slist_t **pp_Var1;
  _bc_slist_t *p_Var2;
  
  p_Var2 = ast;
  if (ast != (bc_slist_t *)0x0) {
    do {
      __ptr = p_Var2->data;
      if (__ptr != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
        free(*(void **)((long)__ptr + 0x10));
        free(__ptr);
      }
      pp_Var1 = &p_Var2->next;
      p_Var2 = *pp_Var1;
    } while (*pp_Var1 != (_bc_slist_t *)0x0);
  }
  bc_slist_free(ast);
  return;
}

Assistant:

void
blogc_template_free_ast(bc_slist_t *ast)
{
    for (bc_slist_t *tmp = ast; tmp != NULL; tmp = tmp->next) {
        blogc_template_node_t *data = tmp->data;
        if (data == NULL)
            continue;
        free(data->data[0]);
        free(data->data[1]);
        free(data);
    }
    bc_slist_free(ast);
}